

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Opt *pOVar1;
  Arg *other;
  allocator<char> local_2f41;
  string local_2f40;
  allocator<char> local_2f19;
  string local_2f18;
  ParserRefImpl<Catch::Clara::Arg> local_2ef8;
  allocator<char> local_2e91;
  string local_2e90;
  allocator<char> local_2e69;
  string local_2e68;
  Opt local_2e48;
  allocator<char> local_2dc9;
  string local_2dc8;
  allocator<char> local_2da1;
  string local_2da0;
  allocator<char> local_2d79;
  string local_2d78;
  Opt local_2d58;
  allocator<char> local_2cd9;
  string local_2cd8;
  allocator<char> local_2cb1;
  string local_2cb0;
  allocator<char> local_2c89;
  string local_2c88;
  Opt local_2c68;
  allocator<char> local_2be9;
  string local_2be8;
  allocator<char> local_2bc1;
  string local_2bc0;
  allocator<char> local_2b99;
  string local_2b98;
  Opt local_2b78;
  allocator<char> local_2af9;
  string local_2af8;
  allocator<char> local_2ad1;
  string local_2ad0;
  Opt local_2ab0;
  allocator<char> local_2a31;
  string local_2a30;
  allocator<char> local_2a09;
  string local_2a08;
  allocator<char> local_29e1;
  string local_29e0;
  Opt local_29c0;
  allocator<char> local_2941;
  string local_2940;
  allocator<char> local_2919;
  string local_2918;
  allocator<char> local_28f1;
  string local_28f0;
  Opt local_28d0;
  allocator<char> local_2851;
  string local_2850;
  allocator<char> local_2829;
  string local_2828;
  allocator<char> local_2801;
  string local_2800;
  Opt local_27e0;
  allocator<char> local_2761;
  string local_2760;
  allocator<char> local_2739;
  string local_2738;
  Opt local_2718;
  allocator<char> local_2699;
  string local_2698;
  allocator<char> local_2671;
  string local_2670;
  allocator<char> local_2649;
  string local_2648;
  Opt local_2628;
  allocator<char> local_25a9;
  string local_25a8;
  allocator<char> local_2581;
  string local_2580;
  Opt local_2560;
  allocator<char> local_24e1;
  string local_24e0;
  allocator<char> local_24b9;
  string local_24b8;
  allocator<char> local_2491;
  string local_2490;
  Opt local_2470;
  allocator<char> local_23f1;
  string local_23f0;
  allocator<char> local_23c9;
  string local_23c8;
  allocator<char> local_23a1;
  string local_23a0;
  Opt local_2380;
  allocator<char> local_2301;
  string local_2300;
  allocator<char> local_22d9;
  string local_22d8;
  allocator<char> local_22b1;
  string local_22b0;
  Opt local_2290;
  allocator<char> local_2211;
  string local_2210;
  allocator<char> local_21e9;
  string local_21e8;
  Opt local_21c8;
  allocator<char> local_2149;
  string local_2148;
  allocator<char> local_2121;
  string local_2120;
  Opt local_2100;
  allocator<char> local_2081;
  string local_2080;
  allocator<char> local_2059;
  string local_2058;
  Opt local_2038;
  allocator<char> local_1fb9;
  string local_1fb8;
  allocator<char> local_1f91;
  string local_1f90;
  Opt local_1f70;
  allocator<char> local_1ef1;
  string local_1ef0;
  allocator<char> local_1ec9;
  string local_1ec8;
  allocator<char> local_1ea1;
  string local_1ea0;
  allocator<char> local_1e79;
  string local_1e78;
  Opt local_1e58;
  allocator<char> local_1dd9;
  string local_1dd8;
  allocator<char> local_1db1;
  string local_1db0;
  allocator<char> local_1d89;
  string local_1d88;
  allocator<char> local_1d61;
  string local_1d60;
  Opt local_1d40;
  allocator<char> local_1cc1;
  string local_1cc0;
  allocator<char> local_1c99;
  string local_1c98;
  allocator<char> local_1c71;
  string local_1c70;
  Opt local_1c50;
  allocator<char> local_1bd1;
  string local_1bd0;
  allocator<char> local_1ba9;
  string local_1ba8;
  allocator<char> local_1b81;
  string local_1b80;
  allocator<char> local_1b59;
  string local_1b58;
  Opt local_1b38;
  allocator<char> local_1ab9;
  string local_1ab8;
  allocator<char> local_1a91;
  string local_1a90;
  allocator<char> local_1a69;
  string local_1a68;
  allocator<char> local_1a41;
  string local_1a40;
  Opt local_1a20;
  allocator<char> local_19a1;
  string local_19a0;
  allocator<char> local_1979;
  string local_1978;
  allocator<char> local_1951;
  string local_1950;
  allocator<char> local_1929;
  string local_1928;
  anon_class_8_1_50637480_for_m_lambda local_1908;
  Opt local_1900;
  allocator<char> local_1881;
  string local_1880;
  allocator<char> local_1859;
  string local_1858;
  allocator<char> local_1831;
  string local_1830;
  allocator<char> local_1809;
  string local_1808 [40];
  Opt local_17e0;
  allocator<char> local_1761;
  string local_1760;
  allocator<char> local_1739;
  string local_1738;
  allocator<char> local_1711;
  string local_1710;
  allocator<char> local_16e9;
  string local_16e8;
  anon_class_8_1_50637480_for_m_lambda local_16c8;
  Opt local_16c0;
  allocator<char> local_1641;
  string local_1640;
  allocator<char> local_1619;
  string local_1618;
  allocator<char> local_15f1;
  string local_15f0;
  anon_class_8_1_50637480_for_m_lambda local_15d0;
  Opt local_15c8;
  allocator<char> local_1549;
  string local_1548;
  allocator<char> local_1521;
  string local_1520;
  allocator<char> local_14f9;
  string local_14f8;
  allocator<char> local_14d1;
  string local_14d0;
  Opt local_14b0;
  allocator<char> local_1431;
  string local_1430;
  allocator<char> local_1409;
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8 [40];
  Opt local_1390;
  allocator<char> local_1311;
  string local_1310;
  allocator<char> local_12e9;
  string local_12e8;
  allocator<char> local_12c1;
  string local_12c0;
  allocator<char> local_1299;
  string local_1298;
  Opt local_1278;
  allocator<char> local_11f9;
  string local_11f8;
  allocator<char> local_11d1;
  string local_11d0;
  allocator<char> local_11a9;
  string local_11a8;
  Opt local_1188;
  allocator<char> local_1109;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  allocator<char> local_10b9;
  string local_10b8;
  Opt local_1098;
  allocator<char> local_1019;
  string local_1018;
  allocator<char> local_ff1;
  string local_ff0;
  allocator<char> local_fc9;
  string local_fc8;
  Opt local_fa8;
  allocator<char> local_f29;
  string local_f28;
  allocator<char> local_f01;
  string local_f00;
  allocator<char> local_ed9;
  string local_ed8;
  Opt local_eb8;
  Help local_e30;
  ExeName local_db8;
  Parser local_d90;
  Parser local_d30;
  Parser local_cd0;
  Parser local_c70;
  Parser local_c10;
  Parser local_bb0;
  Parser local_b50;
  Parser local_af0;
  Parser local_a90;
  Parser local_a30;
  Parser local_9d0;
  Parser local_970;
  Parser local_910;
  Parser local_8b0;
  Parser local_850;
  Parser local_7f0;
  Parser local_790;
  Parser local_730;
  Parser local_6d0;
  Parser local_670;
  Parser local_610;
  Parser local_5b0;
  Parser local_550;
  Parser local_4f0;
  Parser local_490;
  Parser local_430;
  Parser local_3d0;
  Parser local_370;
  Parser local_310;
  Parser local_2b0;
  Parser local_250;
  Parser local_1f0;
  Parser local_190;
  Parser local_130;
  Parser local_d0;
  undefined1 local_69;
  anon_class_8_1_50637480_for_m_lambda local_68;
  anon_class_8_1_50637480_for_m_lambda setShardIndex;
  anon_class_8_1_50637480_for_m_lambda setShardCount;
  anon_class_8_1_50637480_for_m_lambda setReporter;
  anon_class_8_1_50637480_for_m_lambda setVerbosity;
  anon_class_8_1_50637480_for_m_lambda setWaitForKeypress;
  anon_class_8_1_50637480_for_m_lambda setDefaultColourMode;
  anon_class_8_1_50637480_for_m_lambda setRngSeed;
  anon_class_8_1_50637480_for_m_lambda setTestOrder;
  anon_class_8_1_50637480_for_m_lambda loadTestNamesFromFile;
  anon_class_8_1_50637480_for_m_lambda setWarning;
  ConfigData *config_local;
  Parser *cli;
  
  local_69 = 0;
  local_68.config = config;
  setShardIndex.config = config;
  setShardCount.config = config;
  setReporter.config = config;
  setVerbosity.config = config;
  setWaitForKeypress.config = config;
  setDefaultColourMode.config = config;
  setRngSeed.config = config;
  setTestOrder.config = config;
  loadTestNamesFromFile.config = config;
  Clara::ExeName::ExeName(&local_db8,&config->processName);
  Clara::Help::Help(&local_e30,&config->showHelp);
  Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
            (&local_d90,&local_db8.super_ComposableParserImpl<Catch::Clara::ExeName>,&local_e30);
  Clara::Opt::Opt(&local_eb8,&config->showSuccessfulTests);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed8,"-s",&local_ed9);
  pOVar1 = Clara::Opt::operator[](&local_eb8,&local_ed8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"--success",&local_f01);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_f00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f28,"include successful tests in output",&local_f29);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_f28);
  Clara::Parser::operator|(&local_d30,&local_d90,pOVar1);
  Clara::Opt::Opt(&local_fa8,&config->shouldDebugBreak);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"-b",&local_fc9);
  pOVar1 = Clara::Opt::operator[](&local_fa8,&local_fc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff0,"--break",&local_ff1);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_ff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1018,"break into debugger on failure",&local_1019);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1018);
  Clara::Parser::operator|(&local_cd0,&local_d30,pOVar1);
  Clara::Opt::Opt(&local_1098,&config->noThrow);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10b8,"-e",&local_10b9);
  pOVar1 = Clara::Opt::operator[](&local_1098,&local_10b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10e0,"--nothrow",&local_10e1);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_10e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1108,"skip exception tests",&local_1109);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1108);
  Clara::Parser::operator|(&local_c70,&local_cd0,pOVar1);
  Clara::Opt::Opt(&local_1188,&config->showInvisibles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a8,"-i",&local_11a9);
  pOVar1 = Clara::Opt::operator[](&local_1188,&local_11a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11d0,"--invisibles",&local_11d1);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_11d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11f8,"show invisibles (tabs, newlines)",&local_11f9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_11f8);
  Clara::Parser::operator|(&local_c10,&local_c70,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1298,"filename",&local_1299);
  Clara::Opt::Opt<std::__cxx11::string,void>(&local_1278,&config->defaultOutputFilename,&local_1298)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c0,"-o",&local_12c1);
  pOVar1 = Clara::Opt::operator[](&local_1278,&local_12c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12e8,"--out",&local_12e9);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_12e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1310,"default output filename",&local_1311);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1310);
  Clara::Parser::operator|(&local_bb0,&local_c10,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_13b8,"name[::key=value]*",&local_13b9);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__0>
            (&local_1390,&setShardCount,local_13b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13e0,"-r",&local_13e1);
  pOVar1 = Clara::Opt::operator[](&local_1390,&local_13e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1408,"--reporter",&local_1409)
  ;
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1430,"reporter to use (defaults to console)",&local_1431);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1430);
  Clara::Parser::operator|(&local_b50,&local_bb0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14d0,"name",&local_14d1);
  Clara::Opt::Opt<std::__cxx11::string,void>(&local_14b0,&config->name,&local_14d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14f8,"-n",&local_14f9);
  pOVar1 = Clara::Opt::operator[](&local_14b0,&local_14f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1520,"--name",&local_1521);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1548,"suite name",&local_1549)
  ;
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1548);
  Clara::Parser::operator|(&local_af0,&local_b50,pOVar1);
  local_15d0.config = config;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__1>(&local_15c8,&local_15d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15f0,"-a",&local_15f1);
  pOVar1 = Clara::Opt::operator[](&local_15c8,&local_15f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1618,"--abort",&local_1619);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1618);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1640,"abort at first failure",&local_1641);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1640);
  Clara::Parser::operator|(&local_a90,&local_af0,pOVar1);
  local_16c8.config = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16e8,"no. failures",&local_16e9);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__2,void>
            (&local_16c0,&local_16c8,&local_16e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1710,"-x",&local_1711);
  pOVar1 = Clara::Opt::operator[](&local_16c0,&local_1710);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1738,"--abortx",&local_1739);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1760,"abort after x failures",&local_1761);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1760);
  Clara::Parser::operator|(&local_a30,&local_a90,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1808,"warning name",&local_1809);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
            (&local_17e0,&loadTestNamesFromFile,local_1808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1830,"-w",&local_1831);
  pOVar1 = Clara::Opt::operator[](&local_17e0,&local_1830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1858,"--warn",&local_1859);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1880,"enable warnings",&local_1881);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1880);
  Clara::Parser::operator|(&local_9d0,&local_a30,pOVar1);
  local_1908.config = config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1928,"yes|no",&local_1929);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__4,void>
            (&local_1900,&local_1908,&local_1928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1950,"-d",&local_1951);
  pOVar1 = Clara::Opt::operator[](&local_1900,&local_1950);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1978,"--durations",&local_1979);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1978);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19a0,"show test durations",&local_19a1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_19a0);
  Clara::Parser::operator|(&local_970,&local_9d0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a40,"seconds",&local_1a41);
  Clara::Opt::Opt<double,void>(&local_1a20,&config->minDuration,&local_1a40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a68,"-D",&local_1a69);
  pOVar1 = Clara::Opt::operator[](&local_1a20,&local_1a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a90,"--min-duration",&local_1a91);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1a90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ab8,
             "show test durations for tests taking at least the given number of seconds",&local_1ab9
            );
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1ab8);
  Clara::Parser::operator|(&local_910,&local_970,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b58,"filename",&local_1b59);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__5,void>
            (&local_1b38,(anon_class_8_1_50637480_for_m_lambda *)&setTestOrder,&local_1b58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b80,"-f",&local_1b81);
  pOVar1 = Clara::Opt::operator[](&local_1b38,&local_1b80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ba8,"--input-file",&local_1ba9);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1ba8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1bd0,"load test names to run from a file",&local_1bd1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1bd0);
  Clara::Parser::operator|(&local_8b0,&local_910,pOVar1);
  Clara::Opt::Opt(&local_1c50,&config->filenamesAsTags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c70,"-#",&local_1c71);
  pOVar1 = Clara::Opt::operator[](&local_1c50,&local_1c70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c98,"--filenames-as-tags",&local_1c99);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1c98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1cc0,"adds a tag for the filename",&local_1cc1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1cc0);
  Clara::Parser::operator|(&local_850,&local_8b0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d60,"section name",&local_1d61);
  Clara::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&local_1d40,&config->sectionsToRun,&local_1d60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d88,"-c",&local_1d89);
  pOVar1 = Clara::Opt::operator[](&local_1d40,&local_1d88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1db0,"--section",&local_1db1);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1db0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1dd8,"specify section to run",&local_1dd9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1dd8);
  Clara::Parser::operator|(&local_7f0,&local_850,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e78,"quiet|normal|high",&local_1e79);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__6,void>
            (&local_1e58,(anon_class_8_1_50637480_for_m_lambda *)&setReporter,&local_1e78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ea0,"-v",&local_1ea1);
  pOVar1 = Clara::Opt::operator[](&local_1e58,&local_1ea0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ec8,"--verbosity",&local_1ec9);
  pOVar1 = Clara::Opt::operator[](pOVar1,&local_1ec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1ef0,"set output verbosity",&local_1ef1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1ef0);
  Clara::Parser::operator|(&local_790,&local_7f0,pOVar1);
  Clara::Opt::Opt(&local_1f70,&config->listTests);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f90,"--list-tests",&local_1f91);
  pOVar1 = Clara::Opt::operator[](&local_1f70,&local_1f90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fb8,"list all/matching test cases",&local_1fb9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_1fb8);
  Clara::Parser::operator|(&local_730,&local_790,pOVar1);
  Clara::Opt::Opt(&local_2038,&config->listTags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2058,"--list-tags",&local_2059);
  pOVar1 = Clara::Opt::operator[](&local_2038,&local_2058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2080,"list all/matching tags",&local_2081);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2080);
  Clara::Parser::operator|(&local_6d0,&local_730,pOVar1);
  Clara::Opt::Opt(&local_2100,&config->listReporters);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2120,"--list-reporters",&local_2121);
  pOVar1 = Clara::Opt::operator[](&local_2100,&local_2120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2148,"list all available reporters",&local_2149);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2148);
  Clara::Parser::operator|(&local_670,&local_6d0,pOVar1);
  Clara::Opt::Opt(&local_21c8,&config->listListeners);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_21e8,"--list-listeners",&local_21e9);
  pOVar1 = Clara::Opt::operator[](&local_21c8,&local_21e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2210,"list all listeners",&local_2211);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2210);
  Clara::Parser::operator|(&local_610,&local_670,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22b0,"decl|lex|rand",&local_22b1);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__7,void>
            (&local_2290,(anon_class_8_1_50637480_for_m_lambda *)&setRngSeed,&local_22b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22d8,"--order",&local_22d9);
  pOVar1 = Clara::Opt::operator[](&local_2290,&local_22d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2300,"test case order (defaults to decl)",&local_2301);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2300);
  Clara::Parser::operator|(&local_5b0,&local_610,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23a0,"\'time\'|\'random-device\'|number",&local_23a1);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__8,void>
            (&local_2380,(anon_class_8_1_50637480_for_m_lambda *)&setDefaultColourMode,&local_23a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23c8,"--rng-seed",&local_23c9)
  ;
  pOVar1 = Clara::Opt::operator[](&local_2380,&local_23c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_23f0,"set a specific seed for random numbers",&local_23f1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_23f0);
  Clara::Parser::operator|(&local_550,&local_5b0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2490,"ansi|win32|none|default",&local_2491);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__9,void>
            (&local_2470,(anon_class_8_1_50637480_for_m_lambda *)&setWaitForKeypress,&local_2490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24b8,"--colour-mode",&local_24b9);
  pOVar1 = Clara::Opt::operator[](&local_2470,&local_24b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24e0,"what color mode should be used as default",&local_24e1);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_24e0);
  Clara::Parser::operator|(&local_4f0,&local_550,pOVar1);
  Clara::Opt::Opt(&local_2560,&config->libIdentify);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2580,"--libidentify",&local_2581);
  pOVar1 = Clara::Opt::operator[](&local_2560,&local_2580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25a8,"report name and version according to libidentify standard",
             &local_25a9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_25a8);
  Clara::Parser::operator|(&local_490,&local_4f0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2648,"never|start|exit|both",&local_2649);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__10,void>
            (&local_2628,(anon_class_8_1_50637480_for_m_lambda *)&setVerbosity,&local_2648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2670,"--wait-for-keypress",&local_2671);
  pOVar1 = Clara::Opt::operator[](&local_2628,&local_2670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2698,"waits for a keypress before exiting",&local_2699);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2698);
  Clara::Parser::operator|(&local_430,&local_490,pOVar1);
  Clara::Opt::Opt(&local_2718,&config->skipBenchmarks);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2738,"--skip-benchmarks",&local_2739);
  pOVar1 = Clara::Opt::operator[](&local_2718,&local_2738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2760,"disable running benchmarks",&local_2761);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2760);
  Clara::Parser::operator|(&local_3d0,&local_430,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2800,"samples",&local_2801);
  Clara::Opt::Opt<unsigned_int,void>(&local_27e0,&config->benchmarkSamples,&local_2800);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2828,"--benchmark-samples",&local_2829);
  pOVar1 = Clara::Opt::operator[](&local_27e0,&local_2828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2850,"number of samples to collect (default: 100)",&local_2851);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2850);
  Clara::Parser::operator|(&local_370,&local_3d0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28f0,"resamples",&local_28f1);
  Clara::Opt::Opt<unsigned_int,void>(&local_28d0,&config->benchmarkResamples,&local_28f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2918,"--benchmark-resamples",&local_2919);
  pOVar1 = Clara::Opt::operator[](&local_28d0,&local_2918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2940,"number of resamples for the bootstrap (default: 100000)",
             &local_2941);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2940);
  Clara::Parser::operator|(&local_310,&local_370,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29e0,"confidence interval",&local_29e1);
  Clara::Opt::Opt<double,void>(&local_29c0,&config->benchmarkConfidenceInterval,&local_29e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a08,"--benchmark-confidence-interval",&local_2a09);
  pOVar1 = Clara::Opt::operator[](&local_29c0,&local_2a08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a30,
             "confidence interval for the bootstrap (between 0 and 1, default: 0.95)",&local_2a31);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2a30);
  Clara::Parser::operator|(&local_2b0,&local_310,pOVar1);
  Clara::Opt::Opt(&local_2ab0,&config->benchmarkNoAnalysis);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2ad0,"--benchmark-no-analysis",&local_2ad1);
  pOVar1 = Clara::Opt::operator[](&local_2ab0,&local_2ad0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2af8,"perform only measurements; do not perform any analysis",
             &local_2af9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2af8);
  Clara::Parser::operator|(&local_250,&local_2b0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b98,"benchmarkWarmupTime",&local_2b99);
  Clara::Opt::Opt<long,void>(&local_2b78,&config->benchmarkWarmupTime,&local_2b98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2bc0,"--benchmark-warmup-time",&local_2bc1);
  pOVar1 = Clara::Opt::operator[](&local_2b78,&local_2bc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2be8,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_2be9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2be8);
  Clara::Parser::operator|(&local_1f0,&local_250,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c88,"shard count",&local_2c89);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__11,void>
            (&local_2c68,(anon_class_8_1_50637480_for_m_lambda *)&setShardIndex,&local_2c88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2cb0,"--shard-count",&local_2cb1);
  pOVar1 = Clara::Opt::operator[](&local_2c68,&local_2cb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2cd8,"split the tests to execute into this many groups",&local_2cd9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2cd8);
  Clara::Parser::operator|(&local_190,&local_1f0,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d78,"shard index",&local_2d79);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__12,void>
            (&local_2d58,&local_68,&local_2d78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2da0,"--shard-index",&local_2da1);
  pOVar1 = Clara::Opt::operator[](&local_2d58,&local_2da0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2dc8,"index of the group of tests to execute (see --shard-count)",
             &local_2dc9);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2dc8);
  Clara::Parser::operator|(&local_130,&local_190,pOVar1);
  Clara::Opt::Opt(&local_2e48,&config->allowZeroTests);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e68,"--allow-running-no-tests",&local_2e69);
  pOVar1 = Clara::Opt::operator[](&local_2e48,&local_2e68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e90,"Treat \'No tests run\' as a success",&local_2e91);
  pOVar1 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar1->super_ParserRefImpl<Catch::Clara::Opt>,&local_2e90);
  Clara::Parser::operator|(&local_d0,&local_130,pOVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f18,"test name|pattern|tags",&local_2f19);
  Clara::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>,void>
            ((Arg *)&local_2ef8,&config->testsOrTags,&local_2f18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f40,"which test or tests to use",&local_2f41);
  other = Clara::Detail::ParserRefImpl<Catch::Clara::Arg>::operator()(&local_2ef8,&local_2f40);
  Clara::Parser::operator|(__return_storage_ptr__,&local_d0,other);
  std::__cxx11::string::~string((string *)&local_2f40);
  std::allocator<char>::~allocator(&local_2f41);
  Clara::Arg::~Arg((Arg *)&local_2ef8);
  std::__cxx11::string::~string((string *)&local_2f18);
  std::allocator<char>::~allocator(&local_2f19);
  Clara::Parser::~Parser(&local_d0);
  std::__cxx11::string::~string((string *)&local_2e90);
  std::allocator<char>::~allocator(&local_2e91);
  std::__cxx11::string::~string((string *)&local_2e68);
  std::allocator<char>::~allocator(&local_2e69);
  Clara::Opt::~Opt(&local_2e48);
  Clara::Parser::~Parser(&local_130);
  std::__cxx11::string::~string((string *)&local_2dc8);
  std::allocator<char>::~allocator(&local_2dc9);
  std::__cxx11::string::~string((string *)&local_2da0);
  std::allocator<char>::~allocator(&local_2da1);
  Clara::Opt::~Opt(&local_2d58);
  std::__cxx11::string::~string((string *)&local_2d78);
  std::allocator<char>::~allocator(&local_2d79);
  Clara::Parser::~Parser(&local_190);
  std::__cxx11::string::~string((string *)&local_2cd8);
  std::allocator<char>::~allocator(&local_2cd9);
  std::__cxx11::string::~string((string *)&local_2cb0);
  std::allocator<char>::~allocator(&local_2cb1);
  Clara::Opt::~Opt(&local_2c68);
  std::__cxx11::string::~string((string *)&local_2c88);
  std::allocator<char>::~allocator(&local_2c89);
  Clara::Parser::~Parser(&local_1f0);
  std::__cxx11::string::~string((string *)&local_2be8);
  std::allocator<char>::~allocator(&local_2be9);
  std::__cxx11::string::~string((string *)&local_2bc0);
  std::allocator<char>::~allocator(&local_2bc1);
  Clara::Opt::~Opt(&local_2b78);
  std::__cxx11::string::~string((string *)&local_2b98);
  std::allocator<char>::~allocator(&local_2b99);
  Clara::Parser::~Parser(&local_250);
  std::__cxx11::string::~string((string *)&local_2af8);
  std::allocator<char>::~allocator(&local_2af9);
  std::__cxx11::string::~string((string *)&local_2ad0);
  std::allocator<char>::~allocator(&local_2ad1);
  Clara::Opt::~Opt(&local_2ab0);
  Clara::Parser::~Parser(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2a30);
  std::allocator<char>::~allocator(&local_2a31);
  std::__cxx11::string::~string((string *)&local_2a08);
  std::allocator<char>::~allocator(&local_2a09);
  Clara::Opt::~Opt(&local_29c0);
  std::__cxx11::string::~string((string *)&local_29e0);
  std::allocator<char>::~allocator(&local_29e1);
  Clara::Parser::~Parser(&local_310);
  std::__cxx11::string::~string((string *)&local_2940);
  std::allocator<char>::~allocator(&local_2941);
  std::__cxx11::string::~string((string *)&local_2918);
  std::allocator<char>::~allocator(&local_2919);
  Clara::Opt::~Opt(&local_28d0);
  std::__cxx11::string::~string((string *)&local_28f0);
  std::allocator<char>::~allocator(&local_28f1);
  Clara::Parser::~Parser(&local_370);
  std::__cxx11::string::~string((string *)&local_2850);
  std::allocator<char>::~allocator(&local_2851);
  std::__cxx11::string::~string((string *)&local_2828);
  std::allocator<char>::~allocator(&local_2829);
  Clara::Opt::~Opt(&local_27e0);
  std::__cxx11::string::~string((string *)&local_2800);
  std::allocator<char>::~allocator(&local_2801);
  Clara::Parser::~Parser(&local_3d0);
  std::__cxx11::string::~string((string *)&local_2760);
  std::allocator<char>::~allocator(&local_2761);
  std::__cxx11::string::~string((string *)&local_2738);
  std::allocator<char>::~allocator(&local_2739);
  Clara::Opt::~Opt(&local_2718);
  Clara::Parser::~Parser(&local_430);
  std::__cxx11::string::~string((string *)&local_2698);
  std::allocator<char>::~allocator(&local_2699);
  std::__cxx11::string::~string((string *)&local_2670);
  std::allocator<char>::~allocator(&local_2671);
  Clara::Opt::~Opt(&local_2628);
  std::__cxx11::string::~string((string *)&local_2648);
  std::allocator<char>::~allocator(&local_2649);
  Clara::Parser::~Parser(&local_490);
  std::__cxx11::string::~string((string *)&local_25a8);
  std::allocator<char>::~allocator(&local_25a9);
  std::__cxx11::string::~string((string *)&local_2580);
  std::allocator<char>::~allocator(&local_2581);
  Clara::Opt::~Opt(&local_2560);
  Clara::Parser::~Parser(&local_4f0);
  std::__cxx11::string::~string((string *)&local_24e0);
  std::allocator<char>::~allocator(&local_24e1);
  std::__cxx11::string::~string((string *)&local_24b8);
  std::allocator<char>::~allocator(&local_24b9);
  Clara::Opt::~Opt(&local_2470);
  std::__cxx11::string::~string((string *)&local_2490);
  std::allocator<char>::~allocator(&local_2491);
  Clara::Parser::~Parser(&local_550);
  std::__cxx11::string::~string((string *)&local_23f0);
  std::allocator<char>::~allocator(&local_23f1);
  std::__cxx11::string::~string((string *)&local_23c8);
  std::allocator<char>::~allocator(&local_23c9);
  Clara::Opt::~Opt(&local_2380);
  std::__cxx11::string::~string((string *)&local_23a0);
  std::allocator<char>::~allocator(&local_23a1);
  Clara::Parser::~Parser(&local_5b0);
  std::__cxx11::string::~string((string *)&local_2300);
  std::allocator<char>::~allocator(&local_2301);
  std::__cxx11::string::~string((string *)&local_22d8);
  std::allocator<char>::~allocator(&local_22d9);
  Clara::Opt::~Opt(&local_2290);
  std::__cxx11::string::~string((string *)&local_22b0);
  std::allocator<char>::~allocator(&local_22b1);
  Clara::Parser::~Parser(&local_610);
  std::__cxx11::string::~string((string *)&local_2210);
  std::allocator<char>::~allocator(&local_2211);
  std::__cxx11::string::~string((string *)&local_21e8);
  std::allocator<char>::~allocator(&local_21e9);
  Clara::Opt::~Opt(&local_21c8);
  Clara::Parser::~Parser(&local_670);
  std::__cxx11::string::~string((string *)&local_2148);
  std::allocator<char>::~allocator(&local_2149);
  std::__cxx11::string::~string((string *)&local_2120);
  std::allocator<char>::~allocator(&local_2121);
  Clara::Opt::~Opt(&local_2100);
  Clara::Parser::~Parser(&local_6d0);
  std::__cxx11::string::~string((string *)&local_2080);
  std::allocator<char>::~allocator(&local_2081);
  std::__cxx11::string::~string((string *)&local_2058);
  std::allocator<char>::~allocator(&local_2059);
  Clara::Opt::~Opt(&local_2038);
  Clara::Parser::~Parser(&local_730);
  std::__cxx11::string::~string((string *)&local_1fb8);
  std::allocator<char>::~allocator(&local_1fb9);
  std::__cxx11::string::~string((string *)&local_1f90);
  std::allocator<char>::~allocator(&local_1f91);
  Clara::Opt::~Opt(&local_1f70);
  Clara::Parser::~Parser(&local_790);
  std::__cxx11::string::~string((string *)&local_1ef0);
  std::allocator<char>::~allocator(&local_1ef1);
  std::__cxx11::string::~string((string *)&local_1ec8);
  std::allocator<char>::~allocator(&local_1ec9);
  std::__cxx11::string::~string((string *)&local_1ea0);
  std::allocator<char>::~allocator(&local_1ea1);
  Clara::Opt::~Opt(&local_1e58);
  std::__cxx11::string::~string((string *)&local_1e78);
  std::allocator<char>::~allocator(&local_1e79);
  Clara::Parser::~Parser(&local_7f0);
  std::__cxx11::string::~string((string *)&local_1dd8);
  std::allocator<char>::~allocator(&local_1dd9);
  std::__cxx11::string::~string((string *)&local_1db0);
  std::allocator<char>::~allocator(&local_1db1);
  std::__cxx11::string::~string((string *)&local_1d88);
  std::allocator<char>::~allocator(&local_1d89);
  Clara::Opt::~Opt(&local_1d40);
  std::__cxx11::string::~string((string *)&local_1d60);
  std::allocator<char>::~allocator(&local_1d61);
  Clara::Parser::~Parser(&local_850);
  std::__cxx11::string::~string((string *)&local_1cc0);
  std::allocator<char>::~allocator(&local_1cc1);
  std::__cxx11::string::~string((string *)&local_1c98);
  std::allocator<char>::~allocator(&local_1c99);
  std::__cxx11::string::~string((string *)&local_1c70);
  std::allocator<char>::~allocator(&local_1c71);
  Clara::Opt::~Opt(&local_1c50);
  Clara::Parser::~Parser(&local_8b0);
  std::__cxx11::string::~string((string *)&local_1bd0);
  std::allocator<char>::~allocator(&local_1bd1);
  std::__cxx11::string::~string((string *)&local_1ba8);
  std::allocator<char>::~allocator(&local_1ba9);
  std::__cxx11::string::~string((string *)&local_1b80);
  std::allocator<char>::~allocator(&local_1b81);
  Clara::Opt::~Opt(&local_1b38);
  std::__cxx11::string::~string((string *)&local_1b58);
  std::allocator<char>::~allocator(&local_1b59);
  Clara::Parser::~Parser(&local_910);
  std::__cxx11::string::~string((string *)&local_1ab8);
  std::allocator<char>::~allocator(&local_1ab9);
  std::__cxx11::string::~string((string *)&local_1a90);
  std::allocator<char>::~allocator(&local_1a91);
  std::__cxx11::string::~string((string *)&local_1a68);
  std::allocator<char>::~allocator(&local_1a69);
  Clara::Opt::~Opt(&local_1a20);
  std::__cxx11::string::~string((string *)&local_1a40);
  std::allocator<char>::~allocator(&local_1a41);
  Clara::Parser::~Parser(&local_970);
  std::__cxx11::string::~string((string *)&local_19a0);
  std::allocator<char>::~allocator(&local_19a1);
  std::__cxx11::string::~string((string *)&local_1978);
  std::allocator<char>::~allocator(&local_1979);
  std::__cxx11::string::~string((string *)&local_1950);
  std::allocator<char>::~allocator(&local_1951);
  Clara::Opt::~Opt(&local_1900);
  std::__cxx11::string::~string((string *)&local_1928);
  std::allocator<char>::~allocator(&local_1929);
  Clara::Parser::~Parser(&local_9d0);
  std::__cxx11::string::~string((string *)&local_1880);
  std::allocator<char>::~allocator(&local_1881);
  std::__cxx11::string::~string((string *)&local_1858);
  std::allocator<char>::~allocator(&local_1859);
  std::__cxx11::string::~string((string *)&local_1830);
  std::allocator<char>::~allocator(&local_1831);
  Clara::Opt::~Opt(&local_17e0);
  std::__cxx11::string::~string(local_1808);
  std::allocator<char>::~allocator(&local_1809);
  Clara::Parser::~Parser(&local_a30);
  std::__cxx11::string::~string((string *)&local_1760);
  std::allocator<char>::~allocator(&local_1761);
  std::__cxx11::string::~string((string *)&local_1738);
  std::allocator<char>::~allocator(&local_1739);
  std::__cxx11::string::~string((string *)&local_1710);
  std::allocator<char>::~allocator(&local_1711);
  Clara::Opt::~Opt(&local_16c0);
  std::__cxx11::string::~string((string *)&local_16e8);
  std::allocator<char>::~allocator(&local_16e9);
  Clara::Parser::~Parser(&local_a90);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator(&local_1641);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator(&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator(&local_15f1);
  Clara::Opt::~Opt(&local_15c8);
  Clara::Parser::~Parser(&local_af0);
  std::__cxx11::string::~string((string *)&local_1548);
  std::allocator<char>::~allocator(&local_1549);
  std::__cxx11::string::~string((string *)&local_1520);
  std::allocator<char>::~allocator(&local_1521);
  std::__cxx11::string::~string((string *)&local_14f8);
  std::allocator<char>::~allocator(&local_14f9);
  Clara::Opt::~Opt(&local_14b0);
  std::__cxx11::string::~string((string *)&local_14d0);
  std::allocator<char>::~allocator(&local_14d1);
  Clara::Parser::~Parser(&local_b50);
  std::__cxx11::string::~string((string *)&local_1430);
  std::allocator<char>::~allocator(&local_1431);
  std::__cxx11::string::~string((string *)&local_1408);
  std::allocator<char>::~allocator(&local_1409);
  std::__cxx11::string::~string((string *)&local_13e0);
  std::allocator<char>::~allocator(&local_13e1);
  Clara::Opt::~Opt(&local_1390);
  std::__cxx11::string::~string(local_13b8);
  std::allocator<char>::~allocator(&local_13b9);
  Clara::Parser::~Parser(&local_bb0);
  std::__cxx11::string::~string((string *)&local_1310);
  std::allocator<char>::~allocator(&local_1311);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::allocator<char>::~allocator(&local_12e9);
  std::__cxx11::string::~string((string *)&local_12c0);
  std::allocator<char>::~allocator(&local_12c1);
  Clara::Opt::~Opt(&local_1278);
  std::__cxx11::string::~string((string *)&local_1298);
  std::allocator<char>::~allocator(&local_1299);
  Clara::Parser::~Parser(&local_c10);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::allocator<char>::~allocator(&local_11f9);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::allocator<char>::~allocator(&local_11a9);
  Clara::Opt::~Opt(&local_1188);
  Clara::Parser::~Parser(&local_c70);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator(&local_1109);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::allocator<char>::~allocator(&local_10e1);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator(&local_10b9);
  Clara::Opt::~Opt(&local_1098);
  Clara::Parser::~Parser(&local_cd0);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator(&local_1019);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  Clara::Opt::~Opt(&local_fa8);
  Clara::Parser::~Parser(&local_d30);
  std::__cxx11::string::~string((string *)&local_f28);
  std::allocator<char>::~allocator(&local_f29);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  std::__cxx11::string::~string((string *)&local_ed8);
  std::allocator<char>::~allocator(&local_ed9);
  Clara::Opt::~Opt(&local_eb8);
  Clara::Parser::~Parser(&local_d90);
  Clara::Help::~Help(&local_e30);
  Clara::ExeName::~ExeName(&local_db8);
  return __return_storage_ptr__;
}

Assistant:

Clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace Clara;

        auto const setWarning = [&]( std::string const& warning ) {
            if ( warning == "NoAssertions" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::NoAssertions);
                return ParserResult::ok( ParseResultType::Matched );
            } else if ( warning == "UnmatchedTestSpec" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::UnmatchedTestSpec);
                return ParserResult::ok( ParseResultType::Matched );
            }

            return ParserResult ::runtimeError(
                "Unrecognised warning option: '" + warning + '\'' );
        };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + '\'' );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = TestRunOrder::Declared;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = TestRunOrder::LexicographicallySorted;
                else if( startsWith( "random", order ) )
                    config.runOrder = TestRunOrder::Randomized;
                else
                    return ParserResult::runtimeError( "Unrecognised ordering: '" + order + '\'' );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed == "time" ) {
                    config.rngSeed = generateRandomSeed(GenerateFrom::Time);
                    return ParserResult::ok(ParseResultType::Matched);
                } else if (seed == "random-device") {
                    config.rngSeed = generateRandomSeed(GenerateFrom::RandomDevice);
                    return ParserResult::ok(ParseResultType::Matched);
                }

                // TODO: ideally we should be parsing uint32_t directly
                //       fix this later when we add new parse overload
                auto parsedSeed = parseUInt( seed, 0 );
                if ( !parsedSeed ) {
                    return ParserResult::runtimeError( "Could not parse '" + seed + "' as seed" );
                }
                config.rngSeed = *parsedSeed;
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setDefaultColourMode = [&]( std::string const& colourMode ) {
            Optional<ColourMode> maybeMode = Catch::Detail::stringToColourMode(toLower( colourMode ));
            if ( !maybeMode ) {
                return ParserResult::runtimeError(
                    "colour mode must be one of: default, ansi, win32, "
                    "or none. '" +
                    colourMode + "' is not recognised" );
            }
            auto mode = *maybeMode;
            if ( !isColourImplAvailable( mode ) ) {
                return ParserResult::runtimeError(
                    "colour mode '" + colourMode +
                    "' is not supported in this binary" );
            }
            config.defaultColourMode = mode;
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + '\'' );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& userReporterSpec ) {
            if ( userReporterSpec.empty() ) {
                return ParserResult::runtimeError( "Received empty reporter spec." );
            }

            Optional<ReporterSpec> parsed =
                parseReporterSpec( userReporterSpec );
            if ( !parsed ) {
                return ParserResult::runtimeError(
                    "Could not parse reporter spec '" + userReporterSpec +
                    "'" );
            }

            auto const& reporterSpec = *parsed;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getFactories();
            auto result = factories.find( reporterSpec.name() );

            if ( result == factories.end() ) {
                return ParserResult::runtimeError(
                    "Unrecognized reporter, '" + reporterSpec.name() +
                    "'. Check available with --list-reporters" );
            }


            const bool hadOutputFile = reporterSpec.outputFile().some();
            config.reporterSpecifications.push_back( CATCH_MOVE( *parsed ) );
            // It would be enough to check this only once at the very end, but
            // there is  not a place where we could call this check, so do it
            // every time it could fail. For valid inputs, this is still called
            // at most once.
            if (!hadOutputFile) {
                int n_reporters_without_file = 0;
                for (auto const& spec : config.reporterSpecifications) {
                    if (spec.outputFile().none()) {
                        n_reporters_without_file++;
                    }
                }
                if (n_reporters_without_file > 1) {
                    return ParserResult::runtimeError( "Only one reporter may have unspecified output file." );
                }
            }

            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setShardCount = [&]( std::string const& shardCount ) {
            auto parsedCount = parseUInt( shardCount );
            if ( !parsedCount ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardCount + "' as shard count" );
            }
            if ( *parsedCount == 0 ) {
                return ParserResult::runtimeError(
                    "Shard count must be positive" );
            }
            config.shardCount = *parsedCount;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto const setShardIndex = [&](std::string const& shardIndex) {
            auto parsedIndex = parseUInt( shardIndex );
            if ( !parsedIndex ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardIndex + "' as shard index" );
            }
            config.shardIndex = *parsedIndex;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.defaultOutputFilename, "filename" )
                ["-o"]["--out"]
                ( "default output filename" )
            | Opt( accept_many, setReporter, "name[::key=value]*" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( accept_many, setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTests )
                ["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all available reporters" )
            | Opt( config.listListeners )
                ["--list-listeners"]
                ( "list all listeners" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|'random-device'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setDefaultColourMode, "ansi|win32|none|default" )
                ["--colour-mode"]
                ( "what color mode should be used as default" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.skipBenchmarks)
                ["--skip-benchmarks"]
                ( "disable running benchmarks")
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Opt( setShardCount, "shard count" )
                ["--shard-count"]
                ( "split the tests to execute into this many groups" )
            | Opt( setShardIndex, "shard index" )
                ["--shard-index"]
                ( "index of the group of tests to execute (see --shard-count)" ) |
            Opt( config.allowZeroTests )
                ["--allow-running-no-tests"]
                ( "Treat 'No tests run' as a success" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }